

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O1

int convert_bits(uint8_t *out,size_t *outlen,int outbits,uint8_t *in,size_t inlen,int inbits,int pad
                )

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  bVar2 = (byte)outbits;
  uVar5 = ~(-1 << (bVar2 & 0x1f));
  bVar3 = (byte)uVar5;
  if (inlen == 0) {
    uVar6 = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    uVar6 = 0;
    do {
      uVar6 = (uint)*in | uVar6 << ((byte)inbits & 0x1f);
      for (iVar4 = iVar4 + inbits; outbits <= iVar4; iVar4 = iVar4 - outbits) {
        sVar1 = *outlen;
        *outlen = sVar1 + 1;
        out[sVar1] = (byte)(uVar6 >> ((char)iVar4 - bVar2 & 0x1f)) & bVar3;
      }
      inlen = inlen - 1;
      in = in + 1;
    } while (inlen != 0);
  }
  if (pad == 0) {
    if (inbits <= iVar4) {
      return 0;
    }
    if ((uVar6 << (bVar2 - (char)iVar4 & 0x1f) & uVar5) != 0) {
      return 0;
    }
  }
  else if (iVar4 != 0) {
    sVar1 = *outlen;
    *outlen = sVar1 + 1;
    out[sVar1] = (byte)(uVar6 << (bVar2 - (char)iVar4 & 0x1f)) & bVar3;
  }
  return 1;
}

Assistant:

static int convert_bits(uint8_t *out, size_t *outlen, int outbits, const uint8_t *in, size_t inlen, int inbits, int pad) {
    uint32_t val = 0;
    int bits = 0;
    uint32_t maxv = (((uint32_t)1) << outbits) - 1;
    while (inlen--) {
        val = (val << inbits) | *(in++);
        bits += inbits;
        while (bits >= outbits) {
            bits -= outbits;
            out[(*outlen)++] = (val >> bits) & maxv;
        }
    }
    if (pad) {
        if (bits) {
            out[(*outlen)++] = (val << (outbits - bits)) & maxv;
        }
    } else if (((val << (outbits - bits)) & maxv) || bits >= inbits) {
        return 0;
    }
    return 1;
}